

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::GetFilenamePath(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  allocator<char> local_31;
  string fn;
  
  std::__cxx11::string::string((string *)&fn,(string *)filename);
  ConvertToUnixSlashes(&fn);
  lVar1 = std::__cxx11::string::rfind((char)&fn,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    goto LAB_001278b7;
  }
  if (lVar1 == 2) {
    if (fn._M_dataplus._M_p[1] != ':') goto LAB_00127852;
    std::__cxx11::string::resize((ulong)&fn);
  }
  else {
    if (lVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"/",&local_31);
      goto LAB_001278b7;
    }
LAB_00127852:
    std::__cxx11::string::resize((ulong)&fn);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fn._M_dataplus._M_p == &fn.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(fn.field_2._M_allocated_capacity._1_7_,fn.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = fn.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = fn._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(fn.field_2._M_allocated_capacity._1_7_,fn.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = fn._M_string_length;
  fn._M_string_length = 0;
  fn.field_2._M_local_buf[0] = '\0';
  fn._M_dataplus._M_p = (pointer)&fn.field_2;
LAB_001278b7:
  std::__cxx11::string::~string((string *)&fn);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenamePath(const std::string& filename)
{
  std::string fn = filename;
  SystemTools::ConvertToUnixSlashes(fn);

  std::string::size_type slash_pos = fn.rfind('/');
  if (slash_pos == 0) {
    return "/";
  }
  if (slash_pos == 2 && fn[1] == ':') {
    // keep the / after a drive letter
    fn.resize(3);
    return fn;
  }
  if (slash_pos == std::string::npos) {
    return "";
  }
  fn.resize(slash_pos);
  return fn;
}